

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void __thiscall tk::_data::_data(_data *this,uint32_t sz)

{
  char *pcVar1;
  uint32_t uVar2;
  
  pcVar1 = (char *)malloc((ulong)sz);
  this->data = pcVar1;
  uVar2 = 0;
  if (pcVar1 != (char *)0x0) {
    uVar2 = sz;
  }
  this->size = uVar2;
  this->owned = pcVar1 != (char *)0x0;
  return;
}

Assistant:

_data::_data(uint32_t sz){
        this->data = (char*)malloc(sz);
        if(!this->data){
            this->size = 0;
            this->owned = false;
        }else{
            this->size = sz;
            this->owned = true;
        }
    }